

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

mallinfo * anon_unknown.dwarf_52ef::do_mallinfo<mallinfo>(void)

{
  mallinfo *in_RDI;
  undefined1 local_80 [8];
  TCMallocStats stats;
  
  TCMallocStats::TCMallocStats((TCMallocStats *)local_80);
  ExtractStats((TCMallocStats *)local_80,(uint64_t *)0x0,(SmallSpanStats *)0x0,(LargeSpanStats *)0x0
              );
  memset(in_RDI,0,0x28);
  in_RDI->arena = (int)stats.metadata_bytes;
  in_RDI->fsmblks = local_80._0_4_ + (int)stats.thread_bytes + (int)stats.central_bytes;
  in_RDI->fordblks = (int)stats.pageheap.system_bytes + (int)stats.pageheap.free_bytes;
  in_RDI->uordblks =
       (((((int)stats.metadata_bytes - local_80._0_4_) - (int)stats.thread_bytes) -
        (int)stats.central_bytes) - (int)stats.pageheap.system_bytes) -
       (int)stats.pageheap.free_bytes;
  return in_RDI;
}

Assistant:

inline Mallinfo do_mallinfo() {
  TCMallocStats stats;
  ExtractStats(&stats, nullptr, nullptr, nullptr);

  // Just some of the fields are filled in.
  Mallinfo info;
  memset(&info, 0, sizeof(info));

  // Note, struct mallinfo contains "int" fields, so some of the size
  // values will be truncated. But thankfully we also have
  // mallinfo2. We're able to produce code for both of those variants.
  using inttp = decltype(info.arena); // int or size_t in practice

  info.arena     = static_cast<inttp>(stats.pageheap.system_bytes);
  info.fsmblks   = static_cast<inttp>(stats.thread_bytes
                                      + stats.central_bytes
                                      + stats.transfer_bytes);
  info.fordblks  = static_cast<inttp>(stats.pageheap.free_bytes +
                                      stats.pageheap.unmapped_bytes);
  info.uordblks  = static_cast<inttp>(stats.pageheap.system_bytes
                                      - stats.thread_bytes
                                      - stats.central_bytes
                                      - stats.transfer_bytes
                                      - stats.pageheap.free_bytes
                                      - stats.pageheap.unmapped_bytes);

  return info;
}